

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClockInference.cpp
# Opt level: O1

void __thiscall
slang::analysis::SampledValueFuncVisitor::visit<slang::ast::NamedValueExpression>
          (SampledValueFuncVisitor *this,NamedValueExpression *expr)

{
  Type *pTVar1;
  bool bVar2;
  KnownSystemName KVar3;
  Diagnostic *this_00;
  string_view arg;
  long lStack_20;
  
  bVar2 = ClockInference::isSampledValueFuncCall((Expression *)expr);
  if (bVar2) {
    KVar3 = ast::CallExpression::getKnownSystemName((CallExpression *)expr);
    pTVar1 = expr[2].super_ValueExpressionBase.super_Expression.type.ptr;
    if (KVar3 == Past) {
      if (pTVar1 != (Type *)0x4) goto LAB_0014b34f;
      lStack_20 = 0x18;
    }
    else {
      if (pTVar1 != (Type *)0x2) goto LAB_0014b34f;
      lStack_20 = 8;
    }
    if (**(int **)(*(long *)&expr[2].super_ValueExpressionBase.super_Expression + lStack_20) == 0x1e
       ) {
LAB_0014b34f:
      this_00 = AnalysisContext::addDiag
                          (this->context,this->parentSymbol,(DiagCode)0x8000e,
                           (expr->super_ValueExpressionBase).super_Expression.sourceRange);
      arg = ast::CallExpression::getSubroutineName((CallExpression *)expr);
      Diagnostic::operator<<(this_00,arg);
      return;
    }
  }
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            if (ClockInference::isSampledValueFuncCall(expr)) {
                auto& call = expr.template as<CallExpression>();
                bool hasClock;
                if (call.getKnownSystemName() == KnownSystemName::Past) {
                    hasClock = call.arguments().size() == 4 &&
                               call.arguments()[3]->kind != ExpressionKind::EmptyArgument;
                }
                else {
                    hasClock = call.arguments().size() == 2 &&
                               call.arguments()[1]->kind != ExpressionKind::EmptyArgument;
                }

                if (!hasClock) {
                    context.addDiag(parentSymbol, diag::SampledValueFuncClock, call.sourceRange)
                        << call.getSubroutineName();
                }
            }
            else if constexpr (HasVisitExprs<T, SampledValueFuncVisitor>) {
                expr.visitExprs(*this);
            }
        }
    }